

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

int parse_all_expressions(SymbolTable *sym)

{
  char *name;
  ListStruct *pLVar1;
  BOOL BVar2;
  TokenType TVar3;
  HashErr HVar4;
  int iVar5;
  List *pLVar6;
  List *pLVar7;
  SymbolInfo val;
  ListStruct *pLVar8;
  int iVar9;
  List dummy;
  List def;
  
  iVar9 = 0;
LAB_00106607:
  while( true ) {
    BVar2 = fetch_next_token(&def.token);
    if (BVar2 == FALSE) {
      return iVar9;
    }
    if (def.token.type != TOK_LEFT_PAREN) {
      fatal_input_error("Expecting \'(\' but not finding one; aborting.\n");
    }
    pLVar6 = parse_expression();
    if (pLVar6 != (List *)0x0) break;
    input_error("stray \'(\' with no following expression!");
  }
  TVar3 = (pLVar6->token).type;
  if (1 < TVar3 - TOK_DEFINE) goto code_r0x0010664c;
  goto LAB_001066a7;
code_r0x0010664c:
  dummy.cdr = (ListStruct *)0x0;
  dummy.token.u = (pLVar6->token).u;
  dummy.token.filename = (pLVar6->token).filename;
  dummy.token.lineno = (pLVar6->token).lineno;
  dummy.token._4_4_ = SUB84((ulong)*(undefined8 *)&pLVar6->token >> 0x20,0);
  dummy.token.type = TOK_LIST;
  dummy.car = pLVar6;
  reduce(&dummy,sym,0);
  if (dummy.car != (ListStruct *)0x0) {
    TVar3 = ((dummy.car)->token).type;
    pLVar6 = dummy.car;
LAB_001066a7:
    if (TVar3 == TOK_DEFOPCODE) {
      iVar5 = parse_defopcode(sym,pLVar6->cdr);
      if (preprocess_only != FALSE) {
        fputs("\n(",_stdout);
        print_list((FILE *)_stdout,pLVar6);
        puts(")");
      }
    }
    else {
      if (TVar3 != TOK_DEFINE) goto LAB_00106607;
      pLVar6 = pLVar6->cdr;
      TVar3 = (pLVar6->token).type;
      pLVar7 = pLVar6;
      if (((TVar3 - TOK_IDENTIFIER < 2) ||
          (((TVar3 == TOK_LIST && (pLVar7 = pLVar6->car, pLVar7 != (List *)0x0)) &&
           ((pLVar7->token).type == TOK_IDENTIFIER)))) &&
         (name = (pLVar7->token).u.string, name != (char *)0x0)) {
        val.p = malloc(0x10);
        *(List **)val.p = pLVar6;
        *(undefined8 *)(val.n + 8) = 0;
        HVar4 = lookup_symbol(sym,name,(SymbolInfo *)&dummy,(char **)0x0);
        pLVar1 = dummy.cdr;
        if (HVar4 == HASH_NOERR) {
          do {
            pLVar8 = pLVar1;
            pLVar1 = pLVar8->car;
          } while (pLVar1 != (ListStruct *)0x0);
          pLVar8->car = (ListStruct *)val;
        }
        else {
          dummy.cdr = (ListStruct *)val.p;
          insert_symbol(sym,name,val);
        }
        iVar5 = 1;
      }
      else {
        parse_error(pLVar6,"Invalid macro name.  Ignoring...\n");
        iVar5 = 0;
      }
    }
    iVar9 = iVar9 + iVar5;
  }
  goto LAB_00106607;
}

Assistant:

int
parse_all_expressions (SymbolTable *sym)
{
  List *new;
  int num_parsed = 0;
  List def;

  while (fetch_next_token (&def.token))
    {
      if (def.token.type != TOK_LEFT_PAREN)
	fatal_input_error ("Expecting '(' but not finding one; aborting.\n");

      /* Read in the expression just defined. */
      new = parse_expression ();
      if (new == NULL)
	{
	  input_error ("stray '(' with no following expression!");
	  continue;
	}

      if (new->token.type != TOK_DEFINE && new->token.type != TOK_DEFOPCODE)
	{
	  List dummy = { NULL, 0 /* new */, { /* new->token */0 } };
	  dummy.car = new;
	  dummy.token = new->token;
	  dummy.token.type = TOK_LIST;
	  reduce (&dummy, sym, 0);
	  new = dummy.car;
	}

      if (new != NULL)
	{
	  if (new->token.type == TOK_DEFINE)
	    num_parsed += parse_define (sym, new->cdr);
	  else if (new->token.type == TOK_DEFOPCODE)
	    {
	      num_parsed += parse_defopcode (sym, new->cdr);

	      if (preprocess_only)
		{
		  fputs ("\n(", stdout);
		  print_list (stdout, new);
		  puts (")");
		}
	    }
	}
    }

  return num_parsed;
}